

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  int iVar1;
  bool bVar2;
  SQTable *in_RCX;
  int *in_RSI;
  long in_RDI;
  SQTable *ddel;
  undefined4 in_stack_ffffffffffffffc8;
  SQObjectPtr *key_00;
  
  iVar1 = *in_RSI;
  if (((iVar1 == 0x1000008) || (iVar1 == 0x5000002)) || (iVar1 == 0x5000004)) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0xe8);
  }
  else if (iVar1 == 0x8000010) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0xd8);
  }
  else if (iVar1 == 0x8000040) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 200);
  }
  else if ((iVar1 == 0x8000100) || (iVar1 == 0x8000200)) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x108);
  }
  else if (iVar1 == 0x8000400) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0xf8);
  }
  else if (iVar1 == 0x8001000) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x118);
  }
  else if (iVar1 == 0x8004000) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x128);
  }
  else if (iVar1 == 0x8010000) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x148);
  }
  else if (iVar1 == 0xa000020) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0xb8);
  }
  else if (iVar1 == 0xa000080) {
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x158);
  }
  else {
    if (iVar1 != 0xa008000) {
      return false;
    }
    key_00 = *(SQObjectPtr **)(*(long *)(in_RDI + 0x128) + 0x138);
  }
  bVar2 = SQTable::Get(in_RCX,key_00,(SQObjectPtr *)CONCAT44(iVar1,in_stack_ffffffffffffffc8));
  return bVar2;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(sq_type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        case OT_USERDATA: ddel = _userdata_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}